

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardSubsumptionDemodulation.cpp
# Opt level: O2

void __thiscall
Inferences::ForwardSubsumptionDemodulation::attach
          (ForwardSubsumptionDemodulation *this,SaturationAlgorithm *salg)

{
  (this->super_ForwardSimplificationEngine).super_InferenceEngine._salg = salg;
  Indexing::RequestedIndex<Indexing::LiteralIndex<Indexing::LiteralClause>_>::request
            (&this->_index,(salg->_imgr)._obj,FSD_SUBST_TREE);
  this->_preorderedOnly = false;
  this->_allowIncompleteness = false;
  if (this->_doSubsumption == true) {
    Indexing::RequestedIndex<Indexing::LiteralIndex<Indexing::LiteralClause>_>::request
              (&this->_unitIndex,(salg->_imgr)._obj,FW_SUBSUMPTION_UNIT_CLAUSE_SUBST_TREE);
    return;
  }
  return;
}

Assistant:

void ForwardSubsumptionDemodulation::attach(SaturationAlgorithm* salg)
{
  ForwardSimplificationEngine::attach(salg);

  _index.request(salg->getIndexManager(), FSD_SUBST_TREE);

  _preorderedOnly = false;
  _allowIncompleteness = false;

  if (_doSubsumption) {
    _unitIndex.request(salg->getIndexManager(), FW_SUBSUMPTION_UNIT_CLAUSE_SUBST_TREE);
  }
}